

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFormatTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::TextureCubeFormatCase::init(TextureCubeFormatCase *this,EVP_PKEY_CTX *ctx)

{
  deUint32 dataType;
  TestLog *pTVar1;
  int iVar2;
  ostream *stream;
  TextureCube *this_00;
  long lVar3;
  long lVar4;
  TextureFormatInfo spec;
  Vec4 gMin;
  ostringstream fmtName;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  long local_398 [2];
  TextureFormatInfo local_388;
  TextureFormat local_340;
  LogGradientFmt local_338;
  undefined1 local_328 [8];
  deUint32 dStack_320;
  float fStack_31c;
  ios_base local_2b0 [272];
  undefined1 local_1a0 [376];
  
  pTVar1 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  if (this->m_dataType == 0) {
    local_340 = glu::mapGLInternalFormat(this->m_format);
  }
  else {
    local_340 = glu::mapGLTransferFormat(this->m_format,this->m_dataType);
  }
  tcu::getTextureFormatInfo(&local_388,&local_340);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  if (this->m_dataType == 0) {
    local_328 = (undefined1  [8])glu::getTextureFormatName;
    _dStack_320 = (_func_int **)CONCAT44(fStack_31c,this->m_format);
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_328,(ostream *)local_1a0);
  }
  else {
    local_328 = (undefined1  [8])glu::getTextureFormatName;
    _dStack_320 = (_func_int **)CONCAT44(fStack_31c,this->m_format);
    stream = tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_328,(ostream *)local_1a0)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(stream,", ",2);
    fStack_3a0 = (float)this->m_dataType;
    local_3a8 = 5.2089296e-38;
    fStack_3a4 = 0.0;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_3a8,stream);
  }
  local_328 = (undefined1  [8])pTVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_320);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&dStack_320,"Cube map texture, ",0x12);
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&dStack_320,(char *)CONCAT44(fStack_3a4,local_3a8),
             CONCAT44(fStack_39c,fStack_3a0));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_320,", ",2);
  std::ostream::operator<<((ostringstream *)&dStack_320,this->m_width);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_320,"x",1);
  std::ostream::operator<<((ostringstream *)&dStack_320,this->m_height);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_320,",\n  fill with ",0xe);
  local_338.valueMax = &local_388.valueMax;
  local_338.valueMin = &local_388.valueMin;
  glu::TextureTestUtil::operator<<((ostream *)&dStack_320,&local_338);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_320," gradient",9);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if ((long *)CONCAT44(fStack_3a4,local_3a8) != local_398) {
    operator_delete((long *)CONCAT44(fStack_3a4,local_3a8),local_398[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_320);
  std::ios_base::~ios_base(local_2b0);
  dataType = this->m_dataType;
  if (dataType == 0) {
    this_00 = (TextureCube *)operator_new(0x180);
    glu::TextureCube::TextureCube(this_00,this->m_renderCtx,this->m_format,this->m_width);
  }
  else {
    this_00 = (TextureCube *)operator_new(0x180);
    glu::TextureCube::TextureCube(this_00,this->m_renderCtx,this->m_format,dataType,this->m_width);
  }
  this->m_texture = this_00;
  lVar4 = 0xb0;
  lVar3 = 0;
  while( true ) {
    fStack_39c = local_388.valueMax.m_data[3];
    tcu::TextureCube::allocLevel(&this->m_texture->m_refTexture,(CubeFace)lVar3,0);
    tcu::fillWithComponentGradients
              (*(PixelBufferAccess **)((long)(this->m_texture->m_refTexture).m_data + lVar4 + -0x20)
               ,(Vec4 *)local_328,(Vec4 *)&local_3a8);
    lVar3 = lVar3 + 1;
    if (lVar3 == 6) break;
    lVar4 = lVar4 + 0x18;
  }
  glu::TextureCube::upload(this->m_texture);
  this->m_curFace = 0;
  this->m_isOk = true;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  iVar2 = std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  return iVar2;
}

Assistant:

void TextureCubeFormatCase::init (void)
{
	TestLog&				log		= m_testCtx.getLog();
	tcu::TextureFormat		fmt		= m_dataType ? glu::mapGLTransferFormat(m_format, m_dataType) : glu::mapGLInternalFormat(m_format);
	tcu::TextureFormatInfo	spec	= tcu::getTextureFormatInfo(fmt);
	std::ostringstream		fmtName;

	if (m_dataType)
		fmtName << glu::getTextureFormatStr(m_format) << ", " << glu::getTypeStr(m_dataType);
	else
		fmtName << glu::getTextureFormatStr(m_format);

	log << TestLog::Message << "Cube map texture, " << fmtName.str() << ", " << m_width << "x" << m_height
							<< ",\n  fill with " << formatGradient(&spec.valueMin, &spec.valueMax) << " gradient"
		<< TestLog::EndMessage;

	DE_ASSERT(m_width == m_height);
	m_texture = m_dataType != GL_NONE
			  ? new glu::TextureCube(m_renderCtx, m_format, m_dataType, m_width)	// Implicit internal format.
		      : new glu::TextureCube(m_renderCtx, m_format, m_width);				// Explicit internal format.

	// Fill level 0.
	for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
	{
		tcu::Vec4 gMin, gMax;

		switch (face)
		{
			case 0: gMin = spec.valueMin.swizzle(0, 1, 2, 3); gMax = spec.valueMax.swizzle(0, 1, 2, 3); break;
			case 1: gMin = spec.valueMin.swizzle(2, 1, 0, 3); gMax = spec.valueMax.swizzle(2, 1, 0, 3); break;
			case 2: gMin = spec.valueMin.swizzle(1, 2, 0, 3); gMax = spec.valueMax.swizzle(1, 2, 0, 3); break;
			case 3: gMin = spec.valueMax.swizzle(0, 1, 2, 3); gMax = spec.valueMin.swizzle(0, 1, 2, 3); break;
			case 4: gMin = spec.valueMax.swizzle(2, 1, 0, 3); gMax = spec.valueMin.swizzle(2, 1, 0, 3); break;
			case 5: gMin = spec.valueMax.swizzle(1, 2, 0, 3); gMax = spec.valueMin.swizzle(1, 2, 0, 3); break;
			default:
				DE_ASSERT(false);
		}

		m_texture->getRefTexture().allocLevel((tcu::CubeFace)face, 0);
		tcu::fillWithComponentGradients(m_texture->getRefTexture().getLevelFace(0, (tcu::CubeFace)face), gMin, gMax);
	}

	// Upload texture data to GL.
	m_texture->upload();

	// Initialize iteration state.
	m_curFace	= 0;
	m_isOk		= true;
}